

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

FT_Error sdf_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  undefined1 uVar1;
  undefined1 uVar2;
  FT_Outline *outline;
  FT_Memory memory;
  FT_Bitmap *bitmap;
  FT_Orientation FVar3;
  FT_Error FVar4;
  int iVar5;
  SDF_Shape *shape;
  SDF_Raster_Params *sdf_params;
  SDF_TRaster *sdf_raster;
  SDF_Params internal_params;
  SDF_Params internal_params_00;
  FT_Error error;
  SDF_Shape *local_40;
  FT_Error local_34;
  
  FVar4 = 6;
  if (params != (FT_Raster_Params *)0x0 && raster != (FT_Raster)0x0) {
    outline = (FT_Outline *)params->source;
    FVar4 = 0x14;
    if (outline != (FT_Outline *)0x0) {
      if ((0 < outline->n_points) && (0 < outline->n_contours)) {
        if (outline->contours == (short *)0x0) {
          return 0x14;
        }
        if (outline->points == (FT_Vector *)0x0) {
          return 0x14;
        }
        if (*(int *)&params[1].target - 0x21U < 0xffffffe1) {
          return 6;
        }
        memory = *(FT_Memory *)raster;
        if (memory == (FT_Memory)0x0) {
          return 0x20;
        }
        FVar3 = FT_Outline_Get_Orientation(outline);
        uVar1 = *(undefined1 *)((long)&params[1].target + 4);
        uVar2 = *(undefined1 *)((long)&params[1].target + 5);
        local_34 = 0;
        shape = (SDF_Shape *)ft_mem_qalloc(memory,0x10,&local_34);
        if (local_34 != 0) {
          return local_34;
        }
        shape->contours = (SDF_Contour *)0x0;
        shape->memory = memory;
        local_40 = shape;
        FVar4 = FT_Outline_Decompose(outline,&sdf_decompose_funcs,shape);
        if (FVar4 != 0) {
          return FVar4;
        }
        internal_params_00.flip_sign = uVar1;
        internal_params_00.orientation = FVar3;
        internal_params_00.flip_y = uVar2;
        internal_params_00._6_2_ = 0;
        bitmap = params->target;
        if (*(char *)((long)&params[1].target + 6) == '\0') {
          internal_params_00.overload_sign = 0;
          iVar5 = sdf_generate_subdivision
                            (internal_params_00,shape,*(uint *)&params[1].target,bitmap);
        }
        else {
          internal_params.overload_sign = (FT_Int)shape;
          internal_params.orientation = FVar3;
          internal_params.flip_sign = uVar1;
          internal_params.flip_y = uVar2;
          internal_params._6_2_ = 0;
          iVar5 = sdf_generate_with_overlaps
                            (internal_params,(SDF_Shape *)(ulong)*(uint *)&params[1].target,
                             (FT_UInt)bitmap,bitmap);
        }
        if (iVar5 != 0) {
          return iVar5;
        }
        sdf_shape_done(&local_40);
      }
      FVar4 = 0;
    }
  }
  return FVar4;
}

Assistant:

static FT_Error
  sdf_raster_render( FT_Raster                raster,
                     const FT_Raster_Params*  params )
  {
    FT_Error                  error      = FT_Err_Ok;
    SDF_TRaster*              sdf_raster = (SDF_TRaster*)raster;
    FT_Outline*               outline    = NULL;
    const SDF_Raster_Params*  sdf_params = (const SDF_Raster_Params*)params;

    FT_Memory   memory = NULL;
    SDF_Shape*  shape  = NULL;
    SDF_Params  internal_params;


    /* check for valid arguments */
    if ( !sdf_raster || !sdf_params )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    outline = (FT_Outline*)sdf_params->root.source;

    /* check whether outline is valid */
    if ( !outline )
    {
      error = FT_THROW( Invalid_Outline );
      goto Exit;
    }

    /* if the outline is empty, return */
    if ( outline->n_points <= 0 || outline->n_contours <= 0 )
      goto Exit;

    /* check whether the outline has valid fields */
    if ( !outline->contours || !outline->points )
    {
      error = FT_THROW( Invalid_Outline );
      goto Exit;
    }

    /* check whether spread is set properly */
    if ( sdf_params->spread > MAX_SPREAD ||
         sdf_params->spread < MIN_SPREAD )
    {
      FT_TRACE0(( "sdf_raster_render:"
                  " The `spread' field of `SDF_Raster_Params' is invalid,\n" ));
      FT_TRACE0(( "                  "
                  " the value of this field must be within [%d, %d].\n",
                  MIN_SPREAD, MAX_SPREAD ));
      FT_TRACE0(( "                  "
                  " Also, you must pass `SDF_Raster_Params' instead of\n" ));
      FT_TRACE0(( "                  "
                  " the default `FT_Raster_Params' while calling\n" ));
      FT_TRACE0(( "                  "
                  " this function and set the fields properly.\n" ));

      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    memory = sdf_raster->memory;
    if ( !memory )
    {
      FT_TRACE0(( "sdf_raster_render:"
                  " Raster not setup properly,\n" ));
      FT_TRACE0(( "                  "
                  " unable to find memory handle.\n" ));

      error = FT_THROW( Invalid_Handle );
      goto Exit;
    }

    /* set up the parameters */
    internal_params.orientation   = FT_Outline_Get_Orientation( outline );
    internal_params.flip_sign     = sdf_params->flip_sign;
    internal_params.flip_y        = sdf_params->flip_y;
    internal_params.overload_sign = 0;

    FT_CALL( sdf_shape_new( memory, &shape ) );

    FT_CALL( sdf_outline_decompose( outline, shape ) );

    if ( sdf_params->overlaps )
      FT_CALL( sdf_generate_with_overlaps( internal_params,
                                           shape, sdf_params->spread,
                                           sdf_params->root.target ) );
    else
      FT_CALL( sdf_generate_subdivision( internal_params,
                                         shape, sdf_params->spread,
                                         sdf_params->root.target ) );

    if ( shape )
      sdf_shape_done( &shape );

  Exit:
    return error;
  }